

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::_build_exact_path_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,uint number_of_exact_path_graphs,bool directed,bool at_most,
          bool pattern)

{
  size_t *psVar1;
  pointer puVar2;
  SVOBitset *this_00;
  BitWord BVar3;
  pointer puVar4;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var5;
  byte bVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  _List_node_base *p_Var9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  SVOBitset *pSVar14;
  pointer pSVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  undefined4 in_register_00000084;
  pointer pSVar23;
  pointer pSVar24;
  uint uVar25;
  ulong uVar26;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path_counts;
  value_type nv;
  value_type nc;
  allocator_type local_18a;
  allocator_type local_189;
  HomomorphismModel *local_188;
  undefined8 local_180;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *local_178;
  uint *local_170;
  ulong local_168;
  pointer local_160;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_158;
  undefined1 local_140 [16];
  undefined1 local_130 [120];
  SVOBitset local_b8;
  
  local_180 = CONCAT44(in_register_00000084,number_of_exact_path_graphs);
  this_00 = (SVOBitset *)(local_130 + 0x78);
  uVar26 = (ulong)size;
  local_b8._data.short_data[0] = local_b8._data.short_data[0] & 0xffffffff00000000;
  local_188 = this;
  local_178 = graph_rows;
  local_170 = idx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,uVar26,
             (value_type_conflict3 *)this_00,&local_189);
  local_168 = uVar26;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_158,uVar26,(value_type *)local_140,&local_18a);
  if ((SVOBitset *)local_140._0_8_ != (SVOBitset *)0x0) {
    operator_delete((void *)local_140._0_8_,local_130._0_8_ - local_140._0_8_);
  }
  if (size != 0) {
    uVar26 = 0;
    do {
      iVar10 = (int)uVar26;
      SVOBitset::SVOBitset
                ((SVOBitset *)local_140,
                 (local_178->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_188->max_graphs * iVar10);
      uVar11 = local_130._112_4_;
      uVar21 = (ulong)(uint)local_130._112_4_;
      if (at_most) {
        pSVar14 = (SVOBitset *)local_140;
        if (0x10 < (uint)local_130._112_4_) {
          pSVar14 = (SVOBitset *)local_140._0_8_;
        }
        iVar17 = iVar10 + 0x3f;
        if (-1 < iVar10) {
          iVar17 = iVar10;
        }
        (pSVar14->_data).short_data[iVar17 >> 6] =
             (pSVar14->_data).short_data[iVar17 >> 6] | 1L << (uVar26 & 0x3f);
      }
      pSVar14 = (SVOBitset *)local_140;
      if (0x10 < uVar11) {
        pSVar14 = (SVOBitset *)local_140._0_8_;
      }
      if (uVar11 != 0) {
        iVar10 = 0;
        uVar20 = 0;
LAB_0012fd9a:
        BVar3 = (pSVar14->_data).short_data[uVar20];
        if (BVar3 == 0) goto code_r0x0012fda3;
        iVar17 = 0;
        for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
          iVar17 = iVar17 + 1;
        }
        if (iVar17 + 1 != iVar10) {
          uVar7 = iVar17 - iVar10;
          do {
            pSVar14 = (SVOBitset *)local_140._0_8_;
            if ((uint)uVar21 < 0x11) {
              pSVar14 = (SVOBitset *)local_140;
            }
            uVar11 = uVar7 + 0x3f;
            if (-1 < (int)uVar7) {
              uVar11 = uVar7;
            }
            bVar6 = (byte)uVar7 & 0x3f;
            (pSVar14->_data).short_data[(int)uVar11 >> 6] =
                 (pSVar14->_data).short_data[(int)uVar11 >> 6] &
                 (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
            SVOBitset::SVOBitset
                      (this_00,(local_178->
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               )._M_impl.super__Vector_impl_data._M_start +
                               uVar7 * local_188->max_graphs);
            uVar25 = local_b8.n_words;
            uVar21 = (ulong)local_b8.n_words;
            if (at_most) {
              uVar13 = this_00;
              if (0x10 < local_b8.n_words) {
                uVar13 = local_b8._data.short_data[0];
              }
              (((SVOBitset *)uVar13)->_data).short_data[(int)uVar11 >> 6] =
                   (((SVOBitset *)uVar13)->_data).short_data[(int)uVar11 >> 6] |
                   1L << ((ulong)uVar7 & 0x3f);
            }
            uVar13 = this_00;
            if (0x10 < uVar25) {
              uVar13 = local_b8._data.long_data;
            }
            if (uVar25 != 0) {
              iVar10 = 0;
              uVar20 = 0;
LAB_0012fe83:
              BVar3 = (((SVOBitset *)uVar13)->_data).short_data[uVar20];
              if (BVar3 == 0) goto code_r0x0012fe8c;
              iVar17 = 0;
              for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
                iVar17 = iVar17 + 1;
              }
              uVar20 = (ulong)(uint)(iVar17 - iVar10);
              if ((iVar17 + 1 != iVar10) && (uVar20 <= uVar26 || directed)) {
                puVar4 = local_158.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                while( true ) {
                  iVar10 = (int)uVar20;
                  uVar13 = local_b8._data.long_data;
                  if ((uint)uVar21 < 0x11) {
                    uVar13 = this_00;
                  }
                  bVar6 = (byte)uVar20 & 0x3f;
                  iVar17 = iVar10 + 0x3f;
                  if (-1 < iVar10) {
                    iVar17 = iVar10;
                  }
                  (((SVOBitset *)uVar13)->_data).short_data[iVar17 >> 6] =
                       (((SVOBitset *)uVar13)->_data).short_data[iVar17 >> 6] &
                       (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                  puVar2 = puVar4 + uVar20;
                  *puVar2 = *puVar2 + 1;
                  uVar21 = (ulong)local_b8.n_words;
                  uVar13 = this_00;
                  if (0x10 < uVar21) {
                    uVar13 = local_b8._data.long_data;
                  }
                  if (uVar21 == 0) break;
                  iVar10 = 0;
                  uVar20 = 0;
                  while (BVar3 = (((SVOBitset *)uVar13)->_data).short_data[uVar20],
                        uVar25 = local_b8.n_words, BVar3 == 0) {
                    uVar20 = uVar20 + 1;
                    iVar10 = iVar10 + -0x40;
                    if (uVar21 == uVar20) goto LAB_0012ff56;
                  }
                  iVar17 = 0;
                  for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
                    iVar17 = iVar17 + 1;
                  }
                  uVar20 = (ulong)(uint)(iVar17 - iVar10);
                  if ((iVar17 + 1 == iVar10) || (uVar26 < uVar20 && !directed)) goto LAB_0012ff56;
                }
                goto LAB_0012ff6b;
              }
LAB_0012ff56:
              if ((SVOBitset *)local_b8._data.short_data[0] != (SVOBitset *)0x0 && 0x10 < uVar25) {
                operator_delete__(local_b8._data.long_data);
              }
            }
LAB_0012ff6b:
            uVar21 = (ulong)(uint)local_130._112_4_;
            pSVar14 = (SVOBitset *)local_140;
            if (0x10 < uVar21) {
              pSVar14 = (SVOBitset *)local_140._0_8_;
            }
            if (uVar21 == 0) goto LAB_0012fdd1;
            iVar10 = 0;
            uVar20 = 0;
            while (BVar3 = (pSVar14->_data).short_data[uVar20], uVar11 = local_130._112_4_,
                  BVar3 == 0) {
              uVar20 = uVar20 + 1;
              iVar10 = iVar10 + -0x40;
              if (uVar21 == uVar20) goto LAB_0012fdbc;
            }
            iVar17 = 0;
            for (; (BVar3 & 1) == 0; BVar3 = BVar3 >> 1 | 0x8000000000000000) {
              iVar17 = iVar17 + 1;
            }
            uVar7 = iVar17 - iVar10;
            if (iVar17 + 1 == iVar10) break;
          } while( true );
        }
LAB_0012fdbc:
        if ((SVOBitset *)local_140._0_8_ != (SVOBitset *)0x0 && 0x10 < uVar11) {
          operator_delete__((void *)local_140._0_8_);
        }
      }
LAB_0012fdd1:
      uVar26 = uVar26 + 1;
    } while (uVar26 != local_168);
    if (size != 0) {
      uVar11 = (int)local_180 + 1;
      uVar26 = 2;
      if (2 < uVar11) {
        uVar26 = (ulong)uVar11;
      }
      uVar21 = 0;
      do {
        iVar10 = (int)uVar21;
        uVar20 = uVar21 & 0xffffffff;
        if (directed) {
          uVar20 = 0;
        }
        local_160 = local_158.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        iVar17 = iVar10 + 0x3f;
        if (-1 < iVar10) {
          iVar17 = iVar10;
        }
        pSVar24 = (local_178->
                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                  )._M_impl.super__Vector_impl_data._M_start +
                  (local_188->max_graphs * iVar10 + *local_170);
        do {
          iVar22 = (int)uVar20;
          if (uVar21 == uVar20 && at_most) {
            pSVar15 = pSVar24;
            if (0x10 < pSVar24->n_words) {
              pSVar15 = (pointer)(pSVar24->_data).short_data[0];
            }
            iVar18 = iVar22 + 0x3f;
            if (-1 < iVar22) {
              iVar18 = iVar22;
            }
            (pSVar15->_data).short_data[iVar18 >> 6] =
                 (pSVar15->_data).short_data[iVar18 >> 6] | 1L << (uVar20 & 0x3f);
          }
          else if ((int)local_180 != 0) {
            iVar18 = iVar22 + 0x3f;
            if (-1 < iVar22) {
              iVar18 = iVar22;
            }
            uVar11 = local_158.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21];
            pSVar15 = (local_178->
                      super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = 1;
            uVar25 = local_188->max_graphs * iVar22 + *local_170;
            uVar7 = iVar10 * local_188->max_graphs + *local_170;
            do {
              if (uVar19 <= uVar11) {
                if (pSVar15[uVar7].n_words < 0x11) {
                  pSVar23 = pSVar15 + uVar7;
                }
                else {
                  pSVar23 = (pointer)pSVar15[uVar7]._data.short_data[0];
                }
                (pSVar23->_data).short_data[iVar18 >> 6] =
                     (pSVar23->_data).short_data[iVar18 >> 6] | 1L << (uVar20 & 0x3f);
                if (!directed) {
                  if (pSVar15[uVar25].n_words < 0x11) {
                    pSVar23 = pSVar15 + uVar25;
                  }
                  else {
                    pSVar23 = (pointer)pSVar15[uVar25]._data.short_data[0];
                  }
                  (pSVar23->_data).short_data[iVar17 >> 6] =
                       (pSVar23->_data).short_data[iVar17 >> 6] | 1L << (uVar21 & 0x3f);
                }
              }
              uVar19 = uVar19 + 1;
              uVar25 = uVar25 + 1;
              uVar7 = uVar7 + 1;
            } while (uVar26 != uVar19);
          }
          uVar20 = (ulong)(iVar22 + 1U);
        } while (iVar22 + 1U < size);
        uVar21 = uVar21 + 1;
      } while (uVar21 != local_168);
    }
  }
  if (pattern && (uint)local_180 != 0) {
    uVar11 = 1;
    do {
      uVar7 = 1;
      if (9 < uVar11) {
        uVar26 = (ulong)uVar11;
        uVar25 = 4;
        do {
          uVar7 = uVar25;
          uVar12 = (uint)uVar26;
          if (uVar12 < 100) {
            uVar7 = uVar7 - 2;
            goto LAB_00130201;
          }
          if (uVar12 < 1000) {
            uVar7 = uVar7 - 1;
            goto LAB_00130201;
          }
          if (uVar12 < 10000) goto LAB_00130201;
          uVar26 = uVar26 / 10000;
          uVar25 = uVar7 + 4;
        } while (99999 < uVar12);
        uVar7 = uVar7 + 1;
      }
LAB_00130201:
      local_b8._data.long_data = (BitWord *)(local_130 + 0x88);
      _Var5._M_head_impl =
           (local_188->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_130 + 0x78),(ulong)uVar7,'\0');
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_b8._data.long_data,local_b8._data.short_data[1]._0_4_,uVar11);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_130 + 0x78),0,0,"exact_path_",0xb);
      paVar16 = &pbVar8->field_2;
      local_140._0_8_ = (pbVar8->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._0_8_ == paVar16) {
        local_130._0_8_ = paVar16->_M_allocated_capacity;
        local_130._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_140._0_8_ = (SVOBitset *)local_130;
      }
      else {
        local_130._0_8_ = paVar16->_M_allocated_capacity;
      }
      local_140._8_8_ = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      p_Var9 = (_List_node_base *)operator_new(0x30);
      uVar13 = local_140._8_8_;
      p_Var9[1]._M_next = p_Var9 + 2;
      if ((SVOBitset *)local_140._0_8_ == (SVOBitset *)local_130) {
        p_Var9[2]._M_next = (_List_node_base *)local_130._0_8_;
        p_Var9[2]._M_prev = (_List_node_base *)local_130._8_8_;
      }
      else {
        p_Var9[1]._M_next = (_List_node_base *)local_140._0_8_;
        p_Var9[2]._M_next = (_List_node_base *)local_130._0_8_;
      }
      local_140._8_8_ = (pointer)0x0;
      local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
      p_Var9[1]._M_prev = (_List_node_base *)uVar13;
      local_140._0_8_ = (SVOBitset *)local_130;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = (size_t *)((long)&(_Var5._M_head_impl)->supplemental_graph_names + 0x10);
      *psVar1 = *psVar1 + 1;
      if ((SVOBitset *)local_140._0_8_ != (SVOBitset *)local_130) {
        operator_delete((void *)local_140._0_8_,local_130._0_8_ + 1);
      }
      if ((SVOBitset *)local_b8._data.short_data[0] != (SVOBitset *)(local_130 + 0x88)) {
        operator_delete(local_b8._data.long_data,local_b8._data.short_data[2] + 1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 <= (uint)local_180);
  }
  *local_170 = *local_170 + (int)local_180;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_158);
  return;
code_r0x0012fda3:
  uVar20 = uVar20 + 1;
  iVar10 = iVar10 + -0x40;
  if (uVar21 == uVar20) goto LAB_0012fdbc;
  goto LAB_0012fd9a;
code_r0x0012fe8c:
  uVar20 = uVar20 + 1;
  iVar10 = iVar10 + -0x40;
  if (uVar21 == uVar20) goto LAB_0012ff56;
  goto LAB_0012fe83;
}

Assistant:

auto HomomorphismModel::_build_exact_path_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
    unsigned number_of_exact_path_graphs, bool directed, bool at_most, bool pattern) -> void
{
    vector<vector<unsigned>> path_counts(size, vector<unsigned>(size, 0));

    // count number of paths from w to v (unless directed, only w >= v, so not v to w)
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        if (at_most)
            nv.set(v);
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            if (at_most)
                nc.set(c);
            for (auto w = nc.find_first(); w != decltype(nc)::npos && (directed ? true : w <= v); w = nc.find_first()) {
                nc.reset(w);
                ++path_counts[v][w];
            }
        }
    }

    for (unsigned v = 0; v < size; ++v) {
        for (unsigned w = (directed ? 0 : v); w < size; ++w) {
            if (at_most && v == w)
                graph_rows[v * max_graphs + idx].set(w);
            else {
                // unless directed, w to v, not v to w, see above
                unsigned path_count = path_counts[w][v];
                for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p) {
                    if (path_count >= p) {
                        graph_rows[v * max_graphs + idx + p - 1].set(w);
                        if (! directed)
                            graph_rows[w * max_graphs + idx + p - 1].set(v);
                    }
                }
            }
        }
    }

    if (pattern)
        for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p)
            _imp->supplemental_graph_names.push_back("exact_path_" + to_string(p));

    idx += number_of_exact_path_graphs;
}